

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O0

bool __thiscall amrex::Amr::writePlotNow(Amr *this)

{
  double *pdVar1;
  int *piVar2;
  pointer pAVar3;
  int iVar4;
  long in_RDI;
  literals *this_00;
  bool bVar5;
  longdouble x;
  double dVar6;
  Real RVar7;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  int num_per_new_1;
  int num_per_old_1;
  Real next_plot_time;
  Real eps;
  int num_per_new;
  int num_per_old;
  int plot_test;
  size_type in_stack_ffffffffffffff58;
  undefined2 in_stack_ffffffffffffff60;
  undefined6 in_stack_ffffffffffffff62;
  byte local_89;
  int local_30;
  int local_2c;
  int local_14;
  int local_10;
  
  bVar5 = false;
  if (0.0 < *(double *)(in_RDI + 0x248)) {
    dVar6 = *(double *)(in_RDI + 0x140);
    this_00 = (literals *)(in_RDI + 0x150);
    pdVar1 = Vector<double,_std::allocator<double>_>::operator[]
                       ((Vector<double,_std::allocator<double>_> *)
                        CONCAT62(in_stack_ffffffffffffff62,in_stack_ffffffffffffff60),
                        in_stack_ffffffffffffff58);
    local_10 = (int)((dVar6 - *pdVar1) / *(double *)(in_RDI + 0x248));
    local_14 = (int)(*(double *)(in_RDI + 0x140) / *(double *)(in_RDI + 0x248));
    dVar6 = std::numeric_limits<double>::epsilon();
    x = (longdouble)10.0;
    in_stack_ffffffffffffff58 = SUB108(x,0);
    in_stack_ffffffffffffff60 = (undefined2)((unkuint10)x >> 0x40);
    RVar7 = literals::operator____rt(this_00,x);
    iVar4 = (int)this_00;
    std::abs(iVar4);
    dVar6 = dVar6 * RVar7 * extraout_XMM0_Qa;
    if ((local_14 == local_10) && (std::abs(iVar4), extraout_XMM0_Qa_00 <= dVar6)) {
      local_14 = local_14 + 1;
    }
    if (local_14 != local_10) {
      iVar4 = (int)in_RDI + 0x150;
      Vector<double,_std::allocator<double>_>::operator[]
                ((Vector<double,_std::allocator<double>_> *)
                 CONCAT62(in_stack_ffffffffffffff62,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff58);
      std::abs(iVar4);
      if (extraout_XMM0_Qa_01 <= dVar6) {
        local_10 = local_10 + 1;
      }
    }
    bVar5 = local_10 != local_14;
  }
  if (0.0 < *(double *)(in_RDI + 0x250)) {
    local_2c = 0;
    local_30 = 0;
    dVar6 = *(double *)(in_RDI + 0x140);
    pdVar1 = Vector<double,_std::allocator<double>_>::operator[]
                       ((Vector<double,_std::allocator<double>_> *)
                        CONCAT62(in_stack_ffffffffffffff62,in_stack_ffffffffffffff60),
                        in_stack_ffffffffffffff58);
    if (0.0 < dVar6 - *pdVar1) {
      dVar6 = *(double *)(in_RDI + 0x140);
      pdVar1 = Vector<double,_std::allocator<double>_>::operator[]
                         ((Vector<double,_std::allocator<double>_> *)
                          CONCAT62(in_stack_ffffffffffffff62,in_stack_ffffffffffffff60),
                          in_stack_ffffffffffffff58);
      dVar6 = log10(dVar6 - *pdVar1);
      local_2c = (int)(dVar6 / *(double *)(in_RDI + 0x250));
    }
    if (0.0 < *(double *)(in_RDI + 0x140)) {
      dVar6 = log10(*(double *)(in_RDI + 0x140));
      local_30 = (int)(dVar6 / *(double *)(in_RDI + 0x250));
    }
    if (local_2c != local_30) {
      bVar5 = true;
    }
  }
  if (0 < *(int *)(in_RDI + 0x240)) {
    piVar2 = Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)
                        CONCAT62(in_stack_ffffffffffffff62,in_stack_ffffffffffffff60),
                        in_stack_ffffffffffffff58);
    local_89 = 1;
    if (*piVar2 % *(int *)(in_RDI + 0x240) == 0) goto LAB_0138a9f9;
  }
  local_89 = 1;
  if (!bVar5) {
    Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                  *)CONCAT62(in_stack_ffffffffffffff62,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff58);
    pAVar3 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
                       ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                        0x138a9da);
    iVar4 = (*pAVar3->_vptr_AmrLevel[0x27])();
    local_89 = (byte)iVar4;
  }
LAB_0138a9f9:
  return (bool)(local_89 & 1);
}

Assistant:

bool
Amr::writePlotNow() noexcept
{
    int plot_test = 0;
    if (plot_per > 0.0)
    {

        // Check to see if we've crossed a plot_per interval by comparing
        // the number of intervals that have elapsed for both the current
        // time and the time at the beginning of this timestep.

        int num_per_old = static_cast<int>((cumtime-dt_level[0]) / plot_per);
        int num_per_new = static_cast<int>((cumtime            ) / plot_per);

        // Before using these, however, we must test for the case where we're
        // within machine epsilon of the next interval. In that case, increment
        // the counter, because we have indeed reached the next plot_per interval
        // at this point.

        const Real eps = std::numeric_limits<Real>::epsilon() * 10.0_rt * std::abs(cumtime);
        const Real next_plot_time = (num_per_old + 1) * plot_per;

        if ((num_per_new == num_per_old) && std::abs(cumtime - next_plot_time) <= eps)
        {
            num_per_new += 1;
        }

        // Similarly, we have to account for the case where the old time is within
        // machine epsilon of the beginning of this interval, so that we don't double
        // count that time threshold -- we already plotted at that time on the last timestep.

        if ((num_per_new != num_per_old) && std::abs((cumtime - dt_level[0]) - next_plot_time) <= eps)
        {
            num_per_old += 1;
        }

        if (num_per_old != num_per_new)
        {
            plot_test = 1;
        }

    }

    if (plot_log_per > 0.0)
    {

        // Check to see if we've crossed a plot_log_per interval by comparing
        // the number of intervals that have elapsed for both the current
        // time and the time at the beginning of this timestep.
        // This only works when cumtime > 0.

        int num_per_old = 0;
        int num_per_new = 0;

        if (cumtime-dt_level[0] > 0.) {
            num_per_old = static_cast<int>(std::log10(cumtime-dt_level[0]) / plot_log_per);
        }
        if (cumtime > 0.) {
            num_per_new = static_cast<int>(std::log10(cumtime) / plot_log_per);
        }

        if (num_per_old != num_per_new)
        {
            plot_test = 1;
        }

    }

    return ( (plot_int > 0 && level_steps[0] % plot_int == 0) ||
              plot_test == 1 ||
              amr_level[0]->writePlotNow());
}